

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O3

int __thiscall QToolBarAreaLayout::remove(QToolBarAreaLayout *this,char *__filename)

{
  int extraout_EAX;
  int extraout_EAX_00;
  pointer pQVar1;
  pointer pQVar2;
  long lVar3;
  ulong i;
  ulong i_00;
  long lVar4;
  QToolBarAreaLayoutInfo *this_00;
  
  lVar3 = 0;
  do {
    if (this->docks[lVar3].lines.d.size != 0) {
      this_00 = this->docks + lVar3;
      i_00 = 0;
      do {
        pQVar1 = QList<QToolBarAreaLayoutLine>::data(&this_00->lines);
        if (pQVar1[i_00].toolBarItems.d.size != 0) {
          lVar4 = 0;
          i = 0;
          do {
            pQVar2 = QList<QToolBarAreaLayoutItem>::data(&pQVar1[i_00].toolBarItems);
            if (*(char **)((long)&pQVar2->widgetItem + lVar4) == __filename) {
              QList<QToolBarAreaLayoutItem>::removeAt(&pQVar1[i_00].toolBarItems,i);
              if (pQVar1[i_00].toolBarItems.d.size != 0) {
                return extraout_EAX;
              }
              QList<QToolBarAreaLayoutLine>::removeAt(&this_00->lines,i_00);
              return extraout_EAX_00;
            }
            i = i + 1;
            lVar4 = lVar4 + 0x18;
          } while (i < (ulong)pQVar1[i_00].toolBarItems.d.size);
        }
        i_00 = i_00 + 1;
      } while (i_00 < (ulong)(this_00->lines).d.size);
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  return 4;
}

Assistant:

void QToolBarAreaLayout::remove(QLayoutItem *item)
{
    for (int i = 0; i < QInternal::DockCount; ++i) {
        QToolBarAreaLayoutInfo &dock = docks[i];

        for (int j = 0; j < dock.lines.size(); ++j) {
            QToolBarAreaLayoutLine &line = dock.lines[j];

            for (int k = 0; k < line.toolBarItems.size(); k++) {
                if (line.toolBarItems[k].widgetItem == item) {
                    line.toolBarItems.removeAt(k);
                    if (line.toolBarItems.isEmpty())
                        dock.lines.removeAt(j);
                    return;
                }
            }
        }
    }
}